

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

void __thiscall baryonyx::itm::shared_subvector::check_index(shared_subvector *this,size_type i)

{
  size_type sVar1;
  size_type sVar2;
  size_type i_local;
  shared_subvector *this_local;
  
  sVar1 = this->m_element_size;
  sVar2 = std::vector<signed_char,_std::allocator<signed_char>_>::size(&this->m_container);
  if (sVar2 < i + sVar1) {
    details::fail_fast("Assertion","i + m_element_size <= m_container.size()",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"182");
  }
  if (i % this->m_element_size != 0) {
    details::fail_fast("Assertion","i % m_element_size == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/branch-and-bound-solver.hpp"
                       ,"183");
  }
  return;
}

Assistant:

void check_index([[maybe_unused]] size_type i) const noexcept
    {
        bx_assert(i + m_element_size <= m_container.size());
        bx_assert(i % m_element_size == 0);
    }